

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O0

void __thiscall
absl::lts_20240722::cord_internal::RefcountAndFlags::Increment(RefcountAndFlags *this)

{
  RefcountAndFlags *this_local;
  
  LOCK();
  (this->count_).super___atomic_base<int>._M_i = (this->count_).super___atomic_base<int>._M_i + 2;
  UNLOCK();
  return;
}

Assistant:

inline void Increment() {
    count_.fetch_add(kRefIncrement, std::memory_order_relaxed);
  }